

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.h
# Opt level: O1

optional<pbrt::Point2<float>_> __thiscall
pbrt::PiecewiseConstant2D::Invert(PiecewiseConstant2D *this,Point2f *p)

{
  float extraout_EDX;
  float extraout_EDX_00;
  Float *in_RDX;
  float fVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 in_XMM3 [16];
  optional<pbrt::Point2<float>_> oVar4;
  optional<float> mInv;
  optional<float> cInv;
  float local_30;
  char local_2c;
  float local_28;
  char local_24;
  
  PiecewiseConstant1D::Invert((PiecewiseConstant1D *)&local_30,in_RDX[1]);
  if (((local_2c == '\0') ||
      (fVar1 = (p->super_Tuple2<pbrt::Point2,_float>).y,
      fVar1 = (in_RDX[1] - fVar1) / (p[1].super_Tuple2<pbrt::Point2,_float>.y - fVar1), fVar1 < 0.0)
      ) || (1.0 < fVar1)) {
    (this->domain).pMax.super_Tuple2<pbrt::Point2,_float>.x = 0.0;
    (this->domain).pMin.super_Tuple2<pbrt::Point2,_float> = (Tuple2<pbrt::Point2,_float>)0x0;
    local_30 = extraout_EDX;
  }
  else {
    auVar2 = vcvtusi2ss_avx512f(in_XMM3,p[5].super_Tuple2<pbrt::Point2,_float>);
    auVar3 = vcvtusi2ss_avx512f(in_XMM3,(long)p[5].super_Tuple2<pbrt::Point2,_float> + -1);
    auVar2 = ZEXT416((uint)(fVar1 * auVar2._0_4_));
    vminss_avx(auVar3,auVar2);
    auVar3._0_12_ = ZEXT812(0);
    auVar3._12_4_ = 0;
    vcmpss_avx512f(auVar2,auVar3,1);
    PiecewiseConstant1D::Invert((PiecewiseConstant1D *)&local_28,*in_RDX);
    if (local_24 == '\0') {
      (this->domain).pMax.super_Tuple2<pbrt::Point2,_float>.x = 0.0;
      (this->domain).pMin.super_Tuple2<pbrt::Point2,_float> = (Tuple2<pbrt::Point2,_float>)0x0;
      local_30 = extraout_EDX_00;
    }
    else {
      if (local_2c == '\0') {
        LogFatal<char_const(&)[4]>
                  (Fatal,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                   ,0xea,"Check failed: %s",(char (*) [4])0x58017c);
      }
      *(undefined1 *)&(this->domain).pMax.super_Tuple2<pbrt::Point2,_float>.x = 1;
      (this->domain).pMin.super_Tuple2<pbrt::Point2,_float>.x = local_28;
      (this->domain).pMin.super_Tuple2<pbrt::Point2,_float>.y = local_30;
    }
  }
  oVar4._8_4_ = local_30;
  oVar4.optionalValue =
       (aligned_storage_t<sizeof(pbrt::Point2<float>),_alignof(pbrt::Point2<float>)>)this;
  return oVar4;
}

Assistant:

PBRT_CPU_GPU
    pstd::optional<Point2f> Invert(const Point2f &p) const {
        pstd::optional<Float> mInv = pMarginal.Invert(p[1]);
        if (!mInv)
            return {};
        Float p1o = (p[1] - domain.pMin[1]) / (domain.pMax[1] - domain.pMin[1]);
        if (p1o < 0 || p1o > 1)
            return {};
        int offset = Clamp(p1o * pConditionalV.size(), 0, pConditionalV.size() - 1);
        pstd::optional<Float> cInv = pConditionalV[offset].Invert(p[0]);
        if (!cInv)
            return {};
        return Point2f(*cInv, *mInv);
    }